

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O0

size_t PAL_fwrite(void *pvBuffer,size_t nSize,size_t nCount,PAL_FILE *pf)

{
  size_t sVar1;
  INT *in_R9;
  size_t nWrittenBytes;
  PAL_FILE *pf_local;
  size_t nCount_local;
  size_t nSize_local;
  void *pvBuffer_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (pf == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_fwrite",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
            ,0x1fb);
    fprintf(_stderr,"Expression: pf != NULL\n");
  }
  sVar1 = CorUnix::InternalFwrite
                    ((CorUnix *)pvBuffer,(void *)nSize,nCount,(size_t)pf->bsdFilePtr,
                     (FILE *)&pf->PALferrorCode,in_R9);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return sVar1;
}

Assistant:

size_t
__cdecl
PAL_fwrite(
    const void *pvBuffer,
    size_t nSize,
    size_t nCount,
    PAL_FILE *pf
    )
{
    size_t nWrittenBytes = 0;

    PERF_ENTRY(fwrite);
    ENTRY( "fwrite( pvBuffer=%p, nSize=%d, nCount=%d, pf=%p )\n",
           pvBuffer, nSize, nCount, pf);
    _ASSERTE(pf != NULL);

    nWrittenBytes = InternalFwrite(pvBuffer, nSize, nCount, pf->bsdFilePtr, &pf->PALferrorCode);

    LOGEXIT( "fwrite returning size_t %d\n", nWrittenBytes );
    PERF_EXIT(fwrite);
    return nWrittenBytes;
}